

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

float * __thiscall ON_3fPoint::operator[](ON_3fPoint *this,uint i)

{
  long lVar1;
  
  lVar1 = 0;
  if (i != 0) {
    lVar1 = (ulong)(1 < i) * 4 + 4;
  }
  return (float *)((long)&this->x + lVar1);
}

Assistant:

float& ON_3fPoint::operator[](unsigned int i)
{
  float* pd = (i<=0)? &x : ( (i>=2) ?  &z : &y);
  return *pd;
}